

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O2

void google::protobuf::compiler::objectivec::anon_unknown_0::PruneFileAndDepsMarkingAsVisited
               (FileDescriptor *file,
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *files,set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      *files_visited)

{
  __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
  __position;
  FileDescriptor *file_00;
  int i;
  int index;
  FileDescriptor *local_20;
  
  local_20 = file;
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptor_const**,std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<google::protobuf::FileDescriptor_const*const>>
                         ((files->
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_start,
                          (files->
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish);
  if (__position._M_current !=
      (files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::erase(files,(const_iterator)__position._M_current);
  }
  std::
  _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
            ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)files_visited,&local_20);
  for (index = 0; index < *(int *)(local_20 + 0x18); index = index + 1) {
    file_00 = FileDescriptor::dependency(local_20,index);
    PruneFileAndDepsMarkingAsVisited(file_00,files,files_visited);
  }
  return;
}

Assistant:

void PruneFileAndDepsMarkingAsVisited(
    const FileDescriptor* file,
    vector<const FileDescriptor*>* files,
    set<const FileDescriptor*>* files_visited) {
  vector<const FileDescriptor*>::iterator iter =
      std::find(files->begin(), files->end(), file);
  if (iter != files->end()) {
    files->erase(iter);
  }
  files_visited->insert(file);
  for (int i = 0; i < file->dependency_count(); i++) {
    PruneFileAndDepsMarkingAsVisited(file->dependency(i), files, files_visited);
  }
}